

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

string * __thiscall
pbrt::CurveCommon::ToString_abi_cxx11_(string *__return_storage_ptr__,CurveCommon *this)

{
  span<const_pbrt::Point3<float>_> local_28;
  Point3f *local_18;
  undefined8 local_10;
  
  local_18 = this->cpObj;
  local_28.ptr = (Point3<float> *)this->width;
  local_10 = 4;
  local_28.n = 2;
  StringPrintf<pbrt::CurveType_const&,pstd::span<pbrt::Point3<float>const>,pstd::span<float_const>,pstd::span<pbrt::Normal3<float>const>,float_const&,float_const&,pbrt::Transform_const&,pbrt::Transform_const&,bool_const&,bool_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ CurveCommon type: %s cpObj: %s width: %s n: %s normalAngle: %f invSinNormalAngle: %f renderFromObject: %s objectFromRender: %s reverseOrientation: %s transformSwapsHandedness: %s ]"
             ,(char *)this,(CurveType *)&local_18,&local_28,
             (span<const_float> *)&stack0xffffffffffffffc8,
             (span<const_pbrt::Normal3<float>_> *)&this->normalAngle,&this->invSinNormalAngle,
             (float *)this->renderFromObject,this->objectFromRender,
             (Transform *)&this->reverseOrientation,&this->transformSwapsHandedness,(bool *)this->n)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string CurveCommon::ToString() const {
    return StringPrintf(
        "[ CurveCommon type: %s cpObj: %s width: %s n: %s normalAngle: %f "
        "invSinNormalAngle: %f renderFromObject: %s "
        "objectFromRender: %s "
        "reverseOrientation: %s transformSwapsHandedness: %s ]",
        type, pstd::MakeSpan(cpObj), pstd::MakeSpan(width), pstd::MakeSpan(n),
        normalAngle, invSinNormalAngle, *renderFromObject, *objectFromRender,
        reverseOrientation, transformSwapsHandedness);
}